

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_pages.c
# Opt level: O0

HPDF_REAL HPDF_Page_GetHorizontalScalling(HPDF_Page page)

{
  HPDF_BOOL HVar1;
  HPDF_PageAttr attr;
  HPDF_Page page_local;
  
  HVar1 = HPDF_Page_Validate(page);
  if (HVar1 == 0) {
    page_local._4_4_ = 100.0;
  }
  else {
    page_local._4_4_ = *(HPDF_REAL *)(*(long *)((long)page->attr + 0x28) + 0x5c);
  }
  return page_local._4_4_;
}

Assistant:

HPDF_EXPORT(HPDF_REAL)
HPDF_Page_GetHorizontalScalling  (HPDF_Page   page)
{
    HPDF_PTRACE((" HPDF_Page_GetHorizontalScalling\n"));

    if (HPDF_Page_Validate (page)) {
        HPDF_PageAttr attr = (HPDF_PageAttr)page->attr;

        return attr->gstate->h_scalling;
    } else
        return HPDF_DEF_HSCALING;
}